

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

_Bool quest_monster_death_check(player *p,monster *mon)

{
  quest *quest_00;
  quest_place *pqVar1;
  quest_place *place;
  quest *quest;
  monster *mon_local;
  player *p_local;
  
  quest_00 = find_quest((int)p->place);
  if (quest_00 == (quest *)0x0) {
    p_local._7_1_ = false;
  }
  else if ((mon->race == quest_00->race) && ((quest_00->complete & 1U) == 0)) {
    quest_00->cur_num = quest_00->cur_num + L'\x01';
    if (quest_00->max_num <= quest_00->cur_num) {
      pqVar1 = find_quest_place(quest_00);
      quest_00->complete = true;
      if ((pqVar1->block & 1U) != 0) {
        build_quest_stairs(p,mon->grid);
      }
      p->upkeep->update = p->upkeep->update | 0x20;
    }
    if ((quest_00->type == L'\x03') && ((quest_00->complete & 1U) != 0)) {
      p->total_winner = 1;
      p->upkeep->redraw = p->upkeep->redraw | 2;
      msg("*** CONGRATULATIONS ***");
      msg("You have won the game!");
      msg("You may retire (key is shift-q) when you are ready.");
    }
    p_local._7_1_ = true;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool quest_monster_death_check(struct player *p, const struct monster *mon)
{
	struct quest *quest = find_quest(p->place);

	/* Simple checks */
	if (!quest) return false;
	if ((mon->race != quest->race) || quest->complete) return false;

	/* Increment count, check for completion */
	quest->cur_num++;
	if (quest->cur_num >= quest->max_num) {
		struct quest_place *place = find_quest_place(quest);
		quest->complete = true;

		/* Build magical stairs if needed */
		if (place->block) {
			build_quest_stairs(p, mon->grid);
		}

		/* Check specialties */
		p->upkeep->update |= (PU_SPECIALTY);
	}

	/* Game over... */
	if ((quest->type == QUEST_FINAL) && quest->complete) {
		p->total_winner = true;
		p->upkeep->redraw |= (PR_TITLE);
		msg("*** CONGRATULATIONS ***");
		msg("You have won the game!");
		msg("You may retire (key is shift-q) when you are ready.");
	}

	return true;
}